

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O3

int ffdrrg(fitsfile *fptr,char *ranges,int *status)

{
  LONGLONG maxrows;
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  char *pcVar5;
  long *minrow;
  long *maxrow;
  ulong uVar6;
  long *rownum;
  uint maxranges;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  size_t __nmemb;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int nranges2;
  uint local_34;
  
  if (0 < *status) {
    return *status;
  }
  if (fptr->HDUposition == fptr->Fptr->curhdu) {
    if ((fptr->Fptr->datastart == -1) && (iVar4 = ffrdef(fptr,status), 0 < iVar4))
    goto LAB_001199fe;
  }
  else {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  if (fptr->Fptr->hdutype == 0) {
    ffpmsg("Can only delete rows in TABLE or BINTABLE extension (ffdrrg)");
    *status = 0xeb;
    return 0xeb;
  }
  maxrows = fptr->Fptr->numrows;
  pcVar5 = strchr(ranges,0x2c);
  maxranges = 1;
  for (; pcVar5 != (char *)0x0; pcVar5 = strchr(pcVar5 + 1,0x2c)) {
    maxranges = maxranges + 1;
  }
  minrow = (long *)calloc((ulong)maxranges,8);
  maxrow = (long *)calloc((ulong)maxranges,8);
  if (minrow == (long *)0x0 || maxrow == (long *)0x0) {
    *status = 0x71;
    ffpmsg("failed to allocate memory for row ranges (ffdrrg)");
    if (maxrow != (long *)0x0) {
      free(maxrow);
    }
    if (minrow == (long *)0x0) goto LAB_001199fe;
  }
  else {
    ffrwrg(ranges,maxrows,maxranges,(int *)&local_34,minrow,maxrow,status);
    iVar4 = *status;
    if (local_34 == 0 || 0 < iVar4) {
      free(maxrow);
      free(minrow);
      return iVar4;
    }
    if ((int)local_34 < 1) {
      __nmemb = 0;
      rownum = (long *)calloc(0,8);
      if (rownum == (long *)0x0) goto LAB_00119a11;
    }
    else {
      uVar6 = 0;
      __nmemb = 0;
      do {
        __nmemb = ((__nmemb + maxrow[uVar6]) - minrow[uVar6]) + 1;
        uVar6 = uVar6 + 1;
      } while (local_34 != uVar6);
      rownum = (long *)calloc(__nmemb,8);
      auVar3 = _DAT_001c9040;
      auVar2 = _DAT_001c9030;
      if (rownum == (long *)0x0) {
LAB_00119a11:
        *status = 0x71;
        ffpmsg("failed to allocate memory for row array (ffdrrg)");
        goto LAB_001199fe;
      }
      if (0 < (int)local_34) {
        uVar6 = 0;
        lVar8 = 0;
        do {
          lVar1 = minrow[uVar6];
          lVar9 = maxrow[uVar6];
          lVar7 = lVar8;
          if (lVar1 <= lVar9) {
            lVar7 = ((lVar8 + lVar9) - lVar1) + 1;
            lVar9 = lVar9 - lVar1;
            auVar11._8_4_ = (int)lVar9;
            auVar11._0_8_ = lVar9;
            auVar11._12_4_ = (int)((ulong)lVar9 >> 0x20);
            auVar11 = auVar11 ^ auVar3;
            uVar10 = 0;
            do {
              auVar12._8_4_ = (int)uVar10;
              auVar12._0_8_ = uVar10;
              auVar12._12_4_ = (int)(uVar10 >> 0x20);
              auVar12 = (auVar12 | auVar2) ^ auVar3;
              if ((bool)(~(auVar11._4_4_ < auVar12._4_4_ ||
                          auVar11._0_4_ < auVar12._0_4_ && auVar12._4_4_ == auVar11._4_4_) & 1)) {
                rownum[lVar8 + uVar10] = lVar1 + uVar10;
              }
              if (auVar12._12_4_ <= auVar11._12_4_ &&
                  (auVar12._8_4_ <= auVar11._8_4_ || auVar12._12_4_ != auVar11._12_4_)) {
                rownum[lVar8 + uVar10 + 1] = lVar1 + uVar10 + 1;
              }
              uVar10 = uVar10 + 2;
            } while ((lVar9 + 2U & 0xfffffffffffffffe) != uVar10);
          }
          uVar6 = uVar6 + 1;
          lVar8 = lVar7;
        } while (uVar6 != local_34);
      }
    }
    ffdrws(fptr,rownum,__nmemb,status);
    free(rownum);
    free(maxrow);
  }
  free(minrow);
LAB_001199fe:
  return *status;
}

Assistant:

int ffdrrg(fitsfile *fptr,  /* I - FITS file pointer to table               */
           char *ranges,    /* I - ranges of rows to delete (1 = first)     */
           int *status)     /* IO - error status                            */
/*
 delete the ranges of rows from the table (1 = first row of table).

The 'ranges' parameter typically looks like:
    '10-20, 30 - 40, 55' or '50-'
and gives a list of rows or row ranges separated by commas.
*/
{
    char *cptr;
    int nranges, nranges2, ii;
    long *minrow, *maxrow, nrows, *rowarray, jj, kk;
    LONGLONG naxis2;
    
    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
    {
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    }
        /* rescan header if data structure is undefined */
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               
            return(*status);

    if ((fptr->Fptr)->hdutype == IMAGE_HDU)
    {
        ffpmsg("Can only delete rows in TABLE or BINTABLE extension (ffdrrg)");
        return(*status = NOT_TABLE);
    }

    /* the NAXIS2 keyword may not be up to date, so use the structure value */
    naxis2 = (fptr->Fptr)->numrows;

    /* find how many ranges were specified ( = no. of commas in string + 1) */
    cptr = ranges;
    for (nranges = 1; (cptr = strchr(cptr, ',')); nranges++)
        cptr++;
 
    minrow = calloc(nranges, sizeof(long));
    maxrow = calloc(nranges, sizeof(long));

    if (!minrow || !maxrow) {
        *status = MEMORY_ALLOCATION;
        ffpmsg("failed to allocate memory for row ranges (ffdrrg)");
        if (maxrow) free(maxrow);
        if (minrow) free(minrow);
        return(*status);
    }

    /* parse range list into array of range min and max values */
    ffrwrg(ranges, naxis2, nranges, &nranges2, minrow, maxrow, status);
    if (*status > 0 || nranges2 == 0) {
        free(maxrow);
        free(minrow);
        return(*status);
    }

    /* determine total number or rows to delete */
    nrows = 0;
    for (ii = 0; ii < nranges2; ii++) {
       nrows = nrows + maxrow[ii] - minrow[ii] + 1;
    }

    rowarray = calloc(nrows, sizeof(long));
    if (!rowarray) {
        *status = MEMORY_ALLOCATION;
        ffpmsg("failed to allocate memory for row array (ffdrrg)");
        return(*status);
    }

    for (kk = 0, ii = 0; ii < nranges2; ii++) {
       for (jj = minrow[ii]; jj <= maxrow[ii]; jj++) {
           rowarray[kk] = jj;
           kk++;
       }
    }

    /* delete the rows */
    ffdrws(fptr, rowarray, nrows, status);
    
    free(rowarray);
    free(maxrow);
    free(minrow);
    return(*status);
}